

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

CallInfo * luaD_precall(lua_State *L,StkId func,int nresults)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  CallInfo *pCVar6;
  uint status;
  lua_CFunction p_Var7;
  ulong uVar8;
  
  status = nresults + 1;
  while( true ) {
    bVar4 = (func->val).tt_ & 0x3f;
    if (bVar4 == 6) {
      lVar2 = *(long *)((func->val).value_.f + 0x18);
      uVar8 = (L->top).offset - (long)func;
      bVar4 = *(byte *)(lVar2 + 10);
      bVar1 = *(byte *)(lVar2 + 0xc);
      if ((long)(L->stack_last).p - (L->top).offset >> 4 <= (long)(ulong)bVar1) {
        lVar3 = (L->stack).offset;
        luaD_growstack(L,(uint)bVar1,1);
        func = (StkId)(((long)func - lVar3) + (long)(L->stack).p);
      }
      pCVar6 = L->ci->next;
      if (pCVar6 == (CallInfo *)0x0) {
        pCVar6 = luaE_extendCI(L);
      }
      L->ci = pCVar6;
      (pCVar6->func).p = func;
      pCVar6->callstatus = status;
      (pCVar6->top).p = func + (ulong)bVar1 + 1;
      L->ci = pCVar6;
      (pCVar6->u).l.savedpc = *(Instruction **)(lVar2 + 0x40);
      iVar5 = (int)(uVar8 >> 4);
      if (iVar5 <= (int)(uint)bVar4) {
        iVar5 = ((uint)bVar4 - iVar5) + 1;
        do {
          lVar2 = (L->top).offset;
          (L->top).p = (StkId)(lVar2 + 0x10);
          *(undefined1 *)(lVar2 + 8) = 0;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      return pCVar6;
    }
    if (bVar4 == 0x16) break;
    if (bVar4 == 0x26) {
      p_Var7 = *(lua_CFunction *)((func->val).value_.f + 0x18);
      goto LAB_0010be31;
    }
    if ((long)(L->stack_last).p - (L->top).offset < 0x11) {
      lVar2 = (L->stack).offset;
      luaD_growstack(L,1,1);
      func = (StkId)(((long)func - lVar2) + (long)(L->stack).p);
    }
    status = tryfuncTM(L,func,status);
  }
  p_Var7 = (func->val).value_.f;
LAB_0010be31:
  if ((long)(L->stack_last).p - (L->top).offset < 0x150) {
    lVar2 = (L->stack).offset;
    luaD_growstack(L,0x14,1);
    func = (StkId)(((long)func - lVar2) + (long)(L->stack).p);
  }
  lVar2 = (L->top).offset;
  pCVar6 = L->ci->next;
  if (pCVar6 == (CallInfo *)0x0) {
    pCVar6 = luaE_extendCI(L);
  }
  L->ci = pCVar6;
  (pCVar6->func).p = func;
  pCVar6->callstatus = status | 0x8000;
  (pCVar6->top).p = (StkId)(lVar2 + 0x140);
  L->ci = pCVar6;
  if ((L->hookmask & 1U) != 0) {
    luaD_hook(L,0,-1,1,(int)((ulong)((long)(L->top).p - (long)func) >> 4) + -1);
  }
  iVar5 = (*p_Var7)(L);
  luaD_poscall(L,pCVar6,iVar5);
  return (CallInfo *)0x0;
}

Assistant:

CallInfo *luaD_precall (lua_State *L, StkId func, int nresults) {
  unsigned status = cast_uint(nresults + 1);
  lua_assert(status <= MAXRESULTS + 1);
 retry:
  switch (ttypetag(s2v(func))) {
    case LUA_VCCL:  /* C closure */
      precallC(L, func, status, clCvalue(s2v(func))->f);
      return NULL;
    case LUA_VLCF:  /* light C function */
      precallC(L, func, status, fvalue(s2v(func)));
      return NULL;
    case LUA_VLCL: {  /* Lua function */
      CallInfo *ci;
      Proto *p = clLvalue(s2v(func))->p;
      int narg = cast_int(L->top.p - func) - 1;  /* number of real arguments */
      int nfixparams = p->numparams;
      int fsize = p->maxstacksize;  /* frame size */
      checkstackp(L, fsize, func);
      L->ci = ci = prepCallInfo(L, func, status, func + 1 + fsize);
      ci->u.l.savedpc = p->code;  /* starting point */
      for (; narg < nfixparams; narg++)
        setnilvalue(s2v(L->top.p++));  /* complete missing arguments */
      lua_assert(ci->top.p <= L->stack_last.p);
      return ci;
    }
    default: {  /* not a function */
      checkstackp(L, 1, func);  /* space for metamethod */
      status = tryfuncTM(L, func, status);  /* try '__call' metamethod */
      goto retry;  /* try again with metamethod */
    }
  }
}